

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall TPZMatrix<Fad<double>_>::Simetrize(TPZMatrix<Fad<double>_> *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar5 = (this->super_TPZBaseMatrix).fRow;
  if (lVar5 != (this->super_TPZBaseMatrix).fCol) {
    Error("Simetrize only work for square matrices",(char *)0x0);
    lVar5 = (this->super_TPZBaseMatrix).fRow;
  }
  lVar1 = 0;
  lVar4 = 0;
  if (0 < lVar5) {
    lVar4 = lVar5;
  }
  while (lVar6 = lVar1, lVar6 != lVar4) {
    for (lVar7 = lVar6 + 1; lVar1 = lVar6 + 1, lVar7 < lVar5; lVar7 = lVar7 + 1) {
      iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,lVar6,lVar7);
      iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,lVar7,lVar6);
      Fad<double>::operator=
                ((Fad<double> *)CONCAT44(extraout_var_00,iVar3),
                 (Fad<double> *)CONCAT44(extraout_var,iVar2));
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}